

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvim.cpp
# Opt level: O3

void __thiscall
nvim::Nvim::buf_set_keymap
          (Nvim *this,Buffer buffer,string *mode,string *lhs,string *rhs,Dictionary *opts)

{
  string local_80;
  Buffer buffer_local;
  variant<_cf2d41c5_> local_58;
  
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  buffer_local = buffer;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"nvim_buf_set_keymap","");
  NvimRPC::
  do_call<long,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::multimap<msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>,msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>,std::less<msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>>,std::allocator<std::pair<msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>const,msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>>>>>
            ((Object *)&local_58,&this->client_,&local_80,&buffer_local,mode,lhs,rhs,opts);
  boost::variant<$cf2d41c5$>::destroy_content(&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Nvim::buf_set_keymap(Buffer buffer, const std::string& mode, const std::string& lhs, const std::string& rhs, const Dictionary& opts) {
    client_.call("nvim_buf_set_keymap", nullptr, buffer, mode, lhs, rhs, opts);
}